

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

bool __thiscall
Js::ByteCodeWriter::TryWriteReg2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
          (ByteCodeWriter *this,OpCode op,RegSlot R0,RegSlot R1,int C1)

{
  bool bVar1;
  int local_e;
  undefined1 local_a;
  undefined1 local_9;
  OpLayoutT_Reg2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> layout;
  
  if ((((DAT_0143bfdd == '\0') && (DAT_0143bfdc == '\0')) && (local_a = (undefined1)R0, R0 < 0x100))
     && (local_9 = (undefined1)R1, R1 < 0x100)) {
    local_e = C1;
    Data::EncodeT<(Js::LayoutSize)0>(&this->m_byteCodeData,op,&local_e,6,this);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ByteCodeWriter::TryWriteReg2Int1(OpCode op, RegSlot R0, RegSlot R1, int C1)
    {
        OpLayoutT_Reg2Int1<SizePolicy> layout;
        if (SizePolicy::Assign(layout.R0, R0) && SizePolicy::Assign(layout.R1, R1) && SizePolicy::Assign(layout.C1, C1))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }